

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int use_psk_identity_hint(UniquePtr<char> *out,char *identity_hint)

{
  bool bVar1;
  size_t sVar2;
  char *__p;
  char *identity_hint_local;
  UniquePtr<char> *out_local;
  
  if ((identity_hint == (char *)0x0) || (sVar2 = strlen(identity_hint), sVar2 < 0x81)) {
    std::unique_ptr<char,_bssl::internal::Deleter>::reset(out,(pointer)0x0);
    if ((identity_hint != (char *)0x0) && (*identity_hint != '\0')) {
      __p = OPENSSL_strdup(identity_hint);
      std::unique_ptr<char,_bssl::internal::Deleter>::reset(out,__p);
      bVar1 = std::operator==(out,(nullptr_t)0x0);
      if (bVar1) {
        return 0;
      }
    }
    out_local._4_4_ = 1;
  }
  else {
    ERR_put_error(0x10,0,0x88,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0xa27);
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static int use_psk_identity_hint(UniquePtr<char> *out,
                                 const char *identity_hint) {
  if (identity_hint != NULL && strlen(identity_hint) > PSK_MAX_IDENTITY_LEN) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DATA_LENGTH_TOO_LONG);
    return 0;
  }

  // Clear currently configured hint, if any.
  out->reset();

  // Treat the empty hint as not supplying one. Plain PSK makes it possible to
  // send either no hint (omit ServerKeyExchange) or an empty hint, while
  // ECDHE_PSK can only spell empty hint. Having different capabilities is odd,
  // so we interpret empty and missing as identical.
  if (identity_hint != NULL && identity_hint[0] != '\0') {
    out->reset(OPENSSL_strdup(identity_hint));
    if (*out == nullptr) {
      return 0;
    }
  }

  return 1;
}